

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiDockNode *
DockBuilderCopyNodeRec
          (ImGuiDockNode *src_node,ImGuiID dst_node_id_if_known,
          ImVector<unsigned_int> *out_node_remap_pairs)

{
  int *piVar1;
  uint *puVar2;
  ImGuiDockNodeFlags IVar3;
  ImGuiDockNode *pIVar4;
  uint *puVar5;
  ImGuiDockNode *pIVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  pIVar4 = ImGui::DockContextAddNode(GImGui,dst_node_id_if_known);
  IVar3 = src_node->LocalFlags;
  pIVar4->SharedFlags = src_node->SharedFlags;
  pIVar4->LocalFlags = IVar3;
  pIVar4->Pos = src_node->Pos;
  pIVar4->Size = src_node->Size;
  pIVar4->SizeRef = src_node->SizeRef;
  pIVar4->SplitAxis = src_node->SplitAxis;
  iVar8 = out_node_remap_pairs->Capacity;
  if (out_node_remap_pairs->Size == iVar8) {
    iVar9 = out_node_remap_pairs->Size + 1;
    if (iVar8 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar8 / 2 + iVar8;
    }
    if (iVar9 < iVar7) {
      iVar9 = iVar7;
    }
    if (iVar8 < iVar9) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      puVar5 = (uint *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
      if (out_node_remap_pairs->Data != (uint *)0x0) {
        memcpy(puVar5,out_node_remap_pairs->Data,(long)out_node_remap_pairs->Size << 2);
        puVar2 = out_node_remap_pairs->Data;
        if ((puVar2 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
      }
      out_node_remap_pairs->Data = puVar5;
      out_node_remap_pairs->Capacity = iVar9;
    }
  }
  out_node_remap_pairs->Data[out_node_remap_pairs->Size] = src_node->ID;
  iVar9 = out_node_remap_pairs->Size;
  iVar7 = out_node_remap_pairs->Capacity;
  iVar8 = iVar9 + 1;
  out_node_remap_pairs->Size = iVar8;
  if (iVar8 == iVar7) {
    iVar9 = iVar9 + 2;
    if (iVar7 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar7 / 2 + iVar7;
    }
    if (iVar9 < iVar8) {
      iVar9 = iVar8;
    }
    if (iVar7 < iVar9) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      puVar5 = (uint *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
      if (out_node_remap_pairs->Data != (uint *)0x0) {
        memcpy(puVar5,out_node_remap_pairs->Data,(long)out_node_remap_pairs->Size << 2);
        puVar2 = out_node_remap_pairs->Data;
        if ((puVar2 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
      }
      out_node_remap_pairs->Data = puVar5;
      out_node_remap_pairs->Capacity = iVar9;
    }
  }
  out_node_remap_pairs->Data[out_node_remap_pairs->Size] = pIVar4->ID;
  out_node_remap_pairs->Size = out_node_remap_pairs->Size + 1;
  lVar10 = 3;
  do {
    if (src_node->ChildNodes[lVar10 + -3] != (ImGuiDockNode *)0x0) {
      pIVar6 = DockBuilderCopyNodeRec(src_node->ChildNodes[lVar10 + -3],0,out_node_remap_pairs);
      pIVar4->ChildNodes[lVar10 + -3] = pIVar6;
      pIVar6->ParentNode = pIVar4;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 == 4);
  return pIVar4;
}

Assistant:

static ImGuiDockNode* DockBuilderCopyNodeRec(ImGuiDockNode* src_node, ImGuiID dst_node_id_if_known, ImVector<ImGuiID>* out_node_remap_pairs)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* dst_node = ImGui::DockContextAddNode(ctx, dst_node_id_if_known);
    dst_node->SharedFlags = src_node->SharedFlags;
    dst_node->LocalFlags = src_node->LocalFlags;
    dst_node->Pos = src_node->Pos;
    dst_node->Size = src_node->Size;
    dst_node->SizeRef = src_node->SizeRef;
    dst_node->SplitAxis = src_node->SplitAxis;

    out_node_remap_pairs->push_back(src_node->ID);
    out_node_remap_pairs->push_back(dst_node->ID);

    for (int child_n = 0; child_n < IM_ARRAYSIZE(src_node->ChildNodes); child_n++)
        if (src_node->ChildNodes[child_n])
        {
            dst_node->ChildNodes[child_n] = DockBuilderCopyNodeRec(src_node->ChildNodes[child_n], 0, out_node_remap_pairs);
            dst_node->ChildNodes[child_n]->ParentNode = dst_node;
        }

    IMGUI_DEBUG_LOG_DOCKING("Fork node %08X -> %08X (%d childs)\n", src_node->ID, dst_node->ID, dst_node->IsSplitNode() ? 2 : 0);
    return dst_node;
}